

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

ssize_t dlep_session_process_buffer(dlep_session *session,void *buffer,size_t length,_Bool is_udp)

{
  ssize_t sVar1;
  char *ptr;
  ssize_t offset;
  ssize_t result;
  size_t sStack_48;
  _Bool is_udp_local;
  size_t length_local;
  void *buffer_local;
  dlep_session *session_local;
  
  ptr = (char *)0x0;
  sStack_48 = length;
  if (((&log_global_mask)[session->log_source] & 1) != 0) {
    oonf_log(1,session->log_source,"src/generic/dlep/dlep_session.c",0x155,0,0,
             "Processing buffer of %zu bytes",length);
  }
  while( true ) {
    if (sStack_48 == 0) {
      return (ssize_t)ptr;
    }
    if (((&log_global_mask)[session->log_source] & 1) != 0) {
      oonf_log(1,session->log_source,"src/generic/dlep/dlep_session.c",0x15a,0,0,
               "Processing message at offset %zd",ptr);
    }
    sVar1 = dlep_session_process_signal(session,(char *)((long)buffer + (long)ptr),sStack_48,is_udp)
    ;
    if (sVar1 < 1) break;
    if (session->restrict_signal == DLEP_KILL_SESSION) {
      return (ssize_t)ptr;
    }
    sStack_48 = sStack_48 - sVar1;
    ptr = ptr + sVar1;
  }
  if (-1 < sVar1) {
    return (ssize_t)ptr;
  }
  return sVar1;
}

Assistant:

ssize_t
dlep_session_process_buffer(struct dlep_session *session, const void *buffer, size_t length, bool is_udp) {
  ssize_t result, offset;
  const char *ptr;

  offset = 0;
  ptr = buffer;

  OONF_DEBUG(session->log_source,
    "Processing buffer of"
    " %" PRINTF_SIZE_T_SPECIFIER " bytes",
    length);
  while (length > 0) {
    OONF_DEBUG(session->log_source,
      "Processing message at offset"
      " %" PRINTF_SSIZE_T_SPECIFIER,
      offset);

    if ((result = dlep_session_process_signal(session, &ptr[offset], length, is_udp)) <= 0) {
      if (result < 0) {
        return result;
      }
      break;
    }

    if (session->restrict_signal == DLEP_KILL_SESSION) {
      return offset;
    }
    length -= result;
    offset += result;
  }
  return offset;
}